

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall adios2::transport::FileStdio::Close(FileStdio *this)

{
  long in_RDI;
  int status;
  allocator *__rhs;
  string *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Transport *this_00;
  string local_120 [16];
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  FileStdio *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  undefined1 local_89 [40];
  allocator local_61;
  string local_60 [32];
  int local_40;
  allocator local_29;
  
  WaitForOpen(in_stack_ffffffffffffff00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd8,"close",&local_29);
  this_00 = (Transport *)&stack0xffffffffffffffd8;
  Transport::ProfilerStart(this_00,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string((string *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_40 = fclose(*(FILE **)(in_RDI + 0xf0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"close",&local_61);
  Transport::ProfilerStop(this_00,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (local_40 == -1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),"Toolkit",(allocator *)__lhs);
    __rhs = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"transport::file::FileStdio",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Close",&local_d9);
    std::operator+((char *)in_stack_fffffffffffffef8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (string *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
  }
  *(undefined1 *)(in_RDI + 0x6c) = 0;
  return;
}

Assistant:

void FileStdio::Close()
{
    WaitForOpen();
    ProfilerStart("close");
    const int status = std::fclose(m_File);
    ProfilerStop("close");

    if (status == EOF)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Close",
                                              "couldn't close file " + m_Name +
                                                  ", in call to stdio fclose");
    }

    m_IsOpen = false;
}